

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O1

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uchar *puVar4;
  uchar *__n;
  size_t *local_50;
  
  iVar1 = *(int *)(*(long *)(ctx + 0x158) + 0x10);
  puVar4 = (uchar *)(long)iVar1;
  if (((*(long *)(ctx + 0x1c8) == 0) || ((*(byte *)(*(long *)(ctx + 0x1c8) + 0x20) & 2) == 0)) &&
     ((long)in % (long)puVar4 != 0)) {
    __assert_fail("(len % blocksize) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/transport.c"
                  ,0x8b,
                  "int decrypt(LIBSSH2_SESSION *, unsigned char *, unsigned char *, ssize_t, int)");
  }
  local_50 = outlen;
  while( true ) {
    uVar3 = inlen & 0xffffffff;
    if ((long)in < 1) {
      return 0;
    }
    __n = puVar4;
    if ((long)in < (long)puVar4) {
      __n = in;
    }
    if ((long)puVar4 < (long)in) {
      uVar3 = 0;
    }
    if ((inlen & 1) != 0) {
      uVar3 = 1;
    }
    if (((*(long *)(ctx + 0x1c8) != 0) && ((inlen & 2) != 0)) &&
       (((*(ulong *)(*(long *)(ctx + 0x1c8) + 0x20) & 2) != 0 && ((long)in < (long)(iVar1 * 2))))) {
      uVar3 = 2;
      __n = in;
    }
    iVar2 = (**(code **)(*(long *)(ctx + 0x158) + 0x30))(ctx,out,__n,ctx + 0x160,uVar3);
    if (iVar2 != 0) break;
    memcpy(local_50,out,(size_t)__n);
    in = in + -(long)__n;
    local_50 = (size_t *)((long)local_50 + (long)__n);
    out = out + (long)__n;
  }
  (**(code **)(ctx + 0x18))(*(undefined8 *)(ctx + 0x8b60),ctx);
  return -0xc;
}

Assistant:

static int
decrypt(LIBSSH2_SESSION * session, unsigned char *source,
        unsigned char *dest, ssize_t len, int firstlast)
{
    struct transportpacket *p = &session->packet;
    int blocksize = session->remote.crypt->blocksize;

    /* if we get called with a len that isn't an even number of blocksizes
       we risk losing those extra bytes. AAD is an exception, since those first
       few bytes aren't encrypted so it throws off the rest of the count. */
    if(!CRYPT_FLAG_L(session, PKTLEN_AAD))
        assert((len % blocksize) == 0);

    while(len > 0) {
        /* normally decrypt up to blocksize bytes at a time */
        ssize_t decryptlen = LIBSSH2_MIN(blocksize, len);
        /* The first block is special (since it needs to be decoded to get the
           length of the remainder of the block) and takes priority. When the
           length finally gets to the last blocksize bytes, and there's no
           more data to come, it's the end. */
        int lowerfirstlast = IS_FIRST(firstlast) ? FIRST_BLOCK :
            ((len <= blocksize) ? firstlast : MIDDLE_BLOCK);
        /* If the last block would be less than a whole blocksize, combine it
           with the previous block to make it larger. This ensures that the
           whole MAC is included in a single decrypt call. */
        if(CRYPT_FLAG_L(session, PKTLEN_AAD) && IS_LAST(firstlast)
           && (len < blocksize*2)) {
            decryptlen = len;
            lowerfirstlast = LAST_BLOCK;
        }

        if(session->remote.crypt->crypt(session, source, decryptlen,
                                        &session->remote.crypt_abstract,
                                        lowerfirstlast)) {
            LIBSSH2_FREE(session, p->payload);
            return LIBSSH2_ERROR_DECRYPT;
        }

        /* if the crypt() function would write to a given address it
           wouldn't have to memcpy() and we could avoid this memcpy()
           too */
        memcpy(dest, source, decryptlen);

        len -= decryptlen;       /* less bytes left */
        dest += decryptlen;      /* advance write pointer */
        source += decryptlen;    /* advance read pointer */
    }
    return LIBSSH2_ERROR_NONE;         /* all is fine */
}